

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnHorizPalCommand::Execute(DrawColumnHorizPalCommand *this,DrawerThread *thread)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  int iVar7;
  
  uVar3 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnHorizCommand)._yl,
                     (this->super_PalColumnHorizCommand)._count);
  if (0 < (int)uVar3) {
    iVar7 = (this->super_PalColumnHorizCommand)._iscale;
    iVar5 = (this->super_PalColumnHorizCommand)._texturefrac;
    puVar2 = (this->super_PalColumnHorizCommand)._source;
    uVar1 = (this->super_PalColumnHorizCommand)._x;
    puVar6 = thread->dc_temp;
    iVar4 = DrawerThread::temp_line_for_thread(thread,(this->super_PalColumnHorizCommand)._yl);
    puVar6 = puVar6 + (ulong)(uVar1 & 3) + (long)iVar4 * 4;
    iVar4 = DrawerThread::skipped_by_thread(thread,(this->super_PalColumnHorizCommand)._yl);
    iVar5 = iVar4 * iVar7 + iVar5;
    iVar7 = iVar7 * thread->num_cores;
    if ((uVar3 & 1) != 0) {
      *puVar6 = puVar2[iVar5 >> 0x10];
      puVar6 = puVar6 + 4;
      iVar5 = iVar5 + iVar7;
    }
    if ((uVar3 & 2) != 0) {
      *puVar6 = puVar2[iVar5 >> 0x10];
      puVar6[4] = puVar2[iVar5 + iVar7 >> 0x10];
      iVar5 = iVar5 + iVar7 + iVar7;
      puVar6 = puVar6 + 8;
    }
    if ((uVar3 & 4) != 0) {
      *puVar6 = puVar2[iVar5 >> 0x10];
      puVar6[4] = puVar2[iVar5 + iVar7 >> 0x10];
      iVar5 = iVar5 + iVar7 + iVar7;
      puVar6[8] = puVar2[iVar5 >> 0x10];
      iVar5 = iVar5 + iVar7;
      puVar6[0xc] = puVar2[iVar5 >> 0x10];
      iVar5 = iVar5 + iVar7;
      puVar6 = puVar6 + 0x10;
    }
    if (7 < uVar3) {
      uVar3 = uVar3 >> 3;
      do {
        *puVar6 = puVar2[iVar5 >> 0x10];
        puVar6[4] = puVar2[iVar5 + iVar7 >> 0x10];
        puVar6[8] = puVar2[iVar7 * 2 + iVar5 >> 0x10];
        puVar6[0xc] = puVar2[iVar7 * 3 + iVar5 >> 0x10];
        puVar6[0x10] = puVar2[iVar7 * 4 + iVar5 >> 0x10];
        puVar6[0x14] = puVar2[iVar7 * 5 + iVar5 >> 0x10];
        puVar6[0x18] = puVar2[iVar7 * 6 + iVar5 >> 0x10];
        puVar6[0x1c] = puVar2[iVar5 + iVar7 * 7 >> 0x10];
        puVar6 = puVar6 + 0x20;
        uVar3 = uVar3 - 1;
        iVar5 = iVar5 + iVar7 + iVar7 * 7;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

void DrawColumnHorizPalCommand::Execute(DrawerThread *thread)
	{
		int count = _count;
		uint8_t *dest;
		fixed_t fracstep;
		fixed_t frac;

		count = thread->count_for_thread(_yl, count);
		if (count <= 0)
			return;

		fracstep = _iscale;
		frac = _texturefrac;

		const uint8_t *source = _source;

		int x = _x & 3;
		dest = &thread->dc_temp[x + thread->temp_line_for_thread(_yl) * 4];
		frac += fracstep * thread->skipped_by_thread(_yl);
		fracstep *= thread->num_cores;

		if (count & 1) {
			*dest = source[frac >> FRACBITS]; dest += 4; frac += fracstep;
		}
		if (count & 2) {
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 8;
		}
		if (count & 4) {
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest[8] = source[frac >> FRACBITS]; frac += fracstep;
			dest[12] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 16;
		}
		count >>= 3;
		if (!count) return;

		do
		{
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest[8] = source[frac >> FRACBITS]; frac += fracstep;
			dest[12] = source[frac >> FRACBITS]; frac += fracstep;
			dest[16] = source[frac >> FRACBITS]; frac += fracstep;
			dest[20] = source[frac >> FRACBITS]; frac += fracstep;
			dest[24] = source[frac >> FRACBITS]; frac += fracstep;
			dest[28] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 32;
		} while (--count);
	}